

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cc
# Opt level: O1

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t size;
  char *in_R8;
  string local_38;
  
  phosg::expect_generic
            (true,"0x0000 != (sign_extend<uint16_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,10);
  phosg::expect_generic
            (true,"0x0001 != (sign_extend<uint16_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xb);
  phosg::expect_generic
            (true,"0x007F != (sign_extend<uint16_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xc);
  phosg::expect_generic
            (true,"0xFF80 != (sign_extend<uint16_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xd);
  phosg::expect_generic
            (true,"0xFFFF != (sign_extend<uint16_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xe);
  phosg::expect_generic
            (true,"0x00000000 != (sign_extend<uint32_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0xf);
  phosg::expect_generic
            (true,"0x00000001 != (sign_extend<uint32_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x10);
  phosg::expect_generic
            (true,"0x0000007F != (sign_extend<uint32_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x11);
  phosg::expect_generic
            (true,"0xFFFFFF80 != (sign_extend<uint32_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x12);
  phosg::expect_generic
            (true,"0xFFFFFFFF != (sign_extend<uint32_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x13);
  phosg::expect_generic
            (true,"0x0000000000000000 != (sign_extend<uint64_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x14);
  phosg::expect_generic
            (true,"0x0000000000000001 != (sign_extend<uint64_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x15);
  phosg::expect_generic
            (true,"0x000000000000007F != (sign_extend<uint64_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x16);
  phosg::expect_generic
            (true,"0xFFFFFFFFFFFFFF80 != (sign_extend<uint64_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x17);
  phosg::expect_generic
            (true,"0xFFFFFFFFFFFFFFFF != (sign_extend<uint64_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x18);
  phosg::expect_generic
            (true,"0x00000000 != (sign_extend<uint32_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x19);
  phosg::expect_generic
            (true,"0x00000001 != (sign_extend<uint32_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1a);
  phosg::expect_generic
            (true,"0x00007FFF != (sign_extend<uint32_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1b);
  phosg::expect_generic
            (true,"0xFFFF8000 != (sign_extend<uint32_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1c);
  phosg::expect_generic
            (true,"0xFFFFFFFF != (sign_extend<uint32_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1d);
  phosg::expect_generic
            (true,"0x0000000000000000 != (sign_extend<uint64_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1e);
  phosg::expect_generic
            (true,"0x0000000000000001 != (sign_extend<uint64_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x1f);
  phosg::expect_generic
            (true,"0x0000000000007FFF != (sign_extend<uint64_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x20);
  phosg::expect_generic
            (true,"0xFFFFFFFFFFFF8000 != (sign_extend<uint64_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x21);
  phosg::expect_generic
            (true,"0xFFFFFFFFFFFFFFFF != (sign_extend<uint64_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x22);
  phosg::expect_generic
            (true,"0x0000000000000000 != (sign_extend<uint64_t, uint32_t>(0x00000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x23);
  phosg::expect_generic
            (true,"0x0000000000000001 != (sign_extend<uint64_t, uint32_t>(0x00000001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x24);
  phosg::expect_generic
            (true,"0x000000007FFFFFFF != (sign_extend<uint64_t, uint32_t>(0x7FFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x25);
  phosg::expect_generic
            (true,"0xFFFFFFFF80000000 != (sign_extend<uint64_t, uint32_t>(0x80000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x26);
  phosg::expect_generic
            (true,"0xFFFFFFFFFFFFFFFF != (sign_extend<uint64_t, uint32_t>(0xFFFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x27);
  phosg::expect_generic
            (true,"0 != (sign_extend<int16_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x29);
  phosg::expect_generic
            (true,"1 != (sign_extend<int16_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2a);
  phosg::expect_generic
            (true,"127 != (sign_extend<int16_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2b);
  phosg::expect_generic
            (true,"-128 != (sign_extend<int16_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2c);
  phosg::expect_generic
            (true,"-1 != (sign_extend<int16_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2d);
  phosg::expect_generic
            (true,"0 != (sign_extend<int32_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2e);
  phosg::expect_generic
            (true,"1 != (sign_extend<int32_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x2f);
  phosg::expect_generic
            (true,"127 != (sign_extend<int32_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x30);
  phosg::expect_generic
            (true,"-128 != (sign_extend<int32_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x31);
  phosg::expect_generic
            (true,"-1 != (sign_extend<int32_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x32);
  phosg::expect_generic
            (true,"0 != (sign_extend<int64_t, uint8_t>(0x00))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x33);
  phosg::expect_generic
            (true,"1 != (sign_extend<int64_t, uint8_t>(0x01))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x34);
  phosg::expect_generic
            (true,"127 != (sign_extend<int64_t, uint8_t>(0x7F))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x35);
  phosg::expect_generic
            (true,"-128 != (sign_extend<int64_t, uint8_t>(0x80))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x36);
  phosg::expect_generic
            (true,"-1 != (sign_extend<int64_t, uint8_t>(0xFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x37);
  phosg::expect_generic
            (true,"0 != (sign_extend<int32_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x38);
  phosg::expect_generic
            (true,"1 != (sign_extend<int32_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x39);
  phosg::expect_generic
            (true,"32767 != (sign_extend<int32_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3a);
  phosg::expect_generic
            (true,"-32768 != (sign_extend<int32_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3b);
  phosg::expect_generic
            (true,"-1 != (sign_extend<int32_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3c);
  phosg::expect_generic
            (true,"0 != (sign_extend<int64_t, uint16_t>(0x0000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3d);
  phosg::expect_generic
            (true,"1 != (sign_extend<int64_t, uint16_t>(0x0001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3e);
  phosg::expect_generic
            (true,"32767 != (sign_extend<int64_t, uint16_t>(0x7FFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x3f);
  phosg::expect_generic
            (true,"-32768 != (sign_extend<int64_t, uint16_t>(0x8000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x40);
  phosg::expect_generic
            (true,"-1 != (sign_extend<int64_t, uint16_t>(0xFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x41);
  phosg::expect_generic
            (true,"0 != (sign_extend<int64_t, uint32_t>(0x00000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x42);
  phosg::expect_generic
            (true,"1 != (sign_extend<int64_t, uint32_t>(0x00000001))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x43);
  phosg::expect_generic
            (true,"2147483647 != (sign_extend<int64_t, uint32_t>(0x7FFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x44);
  phosg::expect_generic
            (true,"-2147483648 != (sign_extend<int64_t, uint32_t>(0x80000000))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x45);
  phosg::expect_generic
            (true,"-1 != (sign_extend<int64_t, uint32_t>(0xFFFFFFFF))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x46);
  phosg::expect_generic
            (true,"0x2301 != bswap16(0x0123)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x48);
  phosg::expect_generic
            (true,"0x452301 != bswap24(0x012345)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x49);
  phosg::expect_generic
            (true,"0x674523 != bswap24(0x01234567)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4a);
  phosg::expect_generic
            (true,"0x67452301 != bswap32(0x01234567)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4b);
  phosg::expect_generic
            (true,"0xEFCDAB8967452301 != bswap64(0x0123456789ABCDEF)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4c);
  phosg::expect_generic
            (true,"(uint16_t)-1 != bswap16(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4e);
  phosg::expect_generic
            (true,"(uint32_t)0x00FFFFFF != bswap24(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x4f);
  phosg::expect_generic
            (true,"(int32_t)-1 != bswap24s(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x50);
  phosg::expect_generic
            (true,"(uint32_t)-1 != bswap32(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x51);
  phosg::expect_generic
            (true,"(uint64_t)-1 != bswap64(-1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x52);
  phosg::expect_generic
            (true,"(uint16_t)-257 != bswap16(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x54);
  phosg::expect_generic
            (true,"(int32_t)-65537 != bswap24s(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x55);
  phosg::expect_generic
            (true,"(uint32_t)-16777217 != bswap32(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x56);
  phosg::expect_generic
            (true,"(uint64_t)-72057594037927937 != bswap64(-2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x57);
  phosg::expect_generic
            (true,"2.6f != bswap32f((uint32_t)0x66662640)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x59);
  phosg::expect_generic
            (true,"0x66662640UL != bswap32f(2.6f)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x5a);
  phosg::expect_generic
            (true,"3.1 != bswap64f((uint64_t)0xCDCCCCCCCCCC0840)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x5b);
  phosg::expect_generic
            (true,"0xCDCCCCCCCCCC0840 != bswap64f(3.1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x5c);
  phosg::expect_generic
            (true,"3 != x",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x61);
  phosg::expect_generic
            (true,"0x03000000 != x.load_raw()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x62);
  phosg::expect_generic
            (true,"3 != y",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,100);
  phosg::expect_generic
            (true,"0x0102030405060708 != x",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x68);
  phosg::expect_generic
            (true,"0x0807060504030201 != x.load_raw()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x69);
  phosg::expect_generic
            (true,"1.0 != x",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x6d);
  phosg::expect_generic
            (true,"0x000000000000F03F != x.load_raw()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x6e);
  phosg::expect_generic
            (true,"data.be32 != 0x04030201",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x79);
  phosg::expect_generic
            (true,"data.bytes[0] != 0x04",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x7a);
  phosg::expect_generic
            (true,"data.le32 != 0x04030201",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x7c);
  phosg::expect_generic
            (true,"data.bytes[0] != 0x01",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x7d);
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)0x11ab8d,(void *)0x0,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"");
  phosg::expect_generic
            (iVar2 == 0,"\"\" != base64_encode(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x81);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)0x119fce,(void *)0x1,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"MQ==");
  phosg::expect_generic
            (iVar2 == 0,"\"MQ==\" != base64_encode(\"1\", 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x82);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)0x11a07b,(void *)0x2,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"MTE=");
  phosg::expect_generic
            (iVar2 == 0,"\"MTE=\" != base64_encode(\"11\", 2)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x83);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)"111",(void *)0x3,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"MTEx");
  phosg::expect_generic
            (iVar2 == 0,"\"MTEx\" != base64_encode(\"111\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x84);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)"1112",(void *)0x4,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"MTExMg==");
  phosg::expect_generic
            (iVar2 == 0,"\"MTExMg==\" != base64_encode(\"1112\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x85);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)"11122",(void *)0x5,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"MTExMjI=");
  phosg::expect_generic
            (iVar2 == 0,"\"MTExMjI=\" != base64_encode(\"11122\", 5)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x86);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_encode_abi_cxx11_(&local_38,(phosg *)"111222",(void *)0x6,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"MTExMjIy");
  phosg::expect_generic
            (iVar2 == 0,"\"MTExMjIy\" != base64_encode(\"111222\", 6)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x87);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)0x11ab8d,(void *)0x0,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"");
  phosg::expect_generic
            (iVar2 == 0,"\"\" != base64_decode(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x89);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)"MQ==",(void *)0x4,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"1");
  phosg::expect_generic
            (iVar2 == 0,"\"1\" != base64_decode(\"MQ==\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)"MTE=",(void *)0x4,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"11");
  phosg::expect_generic
            (iVar2 == 0,"\"11\" != base64_decode(\"MTE=\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)"MTEx",(void *)0x4,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"111");
  phosg::expect_generic
            (iVar2 == 0,"\"111\" != base64_decode(\"MTEx\", 4)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)"MTExMg==",(void *)0x8,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"1112");
  phosg::expect_generic
            (iVar2 == 0,"\"1112\" != base64_decode(\"MTExMg==\", 8)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)"MTExMjI=",(void *)0x8,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"11122");
  phosg::expect_generic
            (iVar2 == 0,"\"11122\" != base64_decode(\"MTExMjI=\", 8)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::base64_decode_abi_cxx11_(&local_38,(phosg *)"MTExMjIy",(void *)0x8,0,in_R8);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"111222");
  size = 0x8f;
  phosg::expect_generic
            (iVar2 == 0,"\"111222\" != base64_decode(\"MTExMjIy\", 8)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x8f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  phosg::rot13_abi_cxx11_
            (&local_38,(phosg *)"Gur oevpx dhbja wbk shzcf bire gur qnml ybt",(void *)0x2b,size);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_38,"The brick quown jox fumps over the dazy log");
  phosg::expect_generic
            (iVar2 == 0,
             "\"The brick quown jox fumps over the dazy log\" != rot13(\"Gur oevpx dhbja wbk shzcf bire gur qnml ybt\", 43)"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/EncodingTest.cc"
             ,0x91);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  puts("EncodingTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  expect_eq(0x0000, (sign_extend<uint16_t, uint8_t>(0x00)));
  expect_eq(0x0001, (sign_extend<uint16_t, uint8_t>(0x01)));
  expect_eq(0x007F, (sign_extend<uint16_t, uint8_t>(0x7F)));
  expect_eq(0xFF80, (sign_extend<uint16_t, uint8_t>(0x80)));
  expect_eq(0xFFFF, (sign_extend<uint16_t, uint8_t>(0xFF)));
  expect_eq(0x00000000, (sign_extend<uint32_t, uint8_t>(0x00)));
  expect_eq(0x00000001, (sign_extend<uint32_t, uint8_t>(0x01)));
  expect_eq(0x0000007F, (sign_extend<uint32_t, uint8_t>(0x7F)));
  expect_eq(0xFFFFFF80, (sign_extend<uint32_t, uint8_t>(0x80)));
  expect_eq(0xFFFFFFFF, (sign_extend<uint32_t, uint8_t>(0xFF)));
  expect_eq(0x0000000000000000, (sign_extend<uint64_t, uint8_t>(0x00)));
  expect_eq(0x0000000000000001, (sign_extend<uint64_t, uint8_t>(0x01)));
  expect_eq(0x000000000000007F, (sign_extend<uint64_t, uint8_t>(0x7F)));
  expect_eq(0xFFFFFFFFFFFFFF80, (sign_extend<uint64_t, uint8_t>(0x80)));
  expect_eq(0xFFFFFFFFFFFFFFFF, (sign_extend<uint64_t, uint8_t>(0xFF)));
  expect_eq(0x00000000, (sign_extend<uint32_t, uint16_t>(0x0000)));
  expect_eq(0x00000001, (sign_extend<uint32_t, uint16_t>(0x0001)));
  expect_eq(0x00007FFF, (sign_extend<uint32_t, uint16_t>(0x7FFF)));
  expect_eq(0xFFFF8000, (sign_extend<uint32_t, uint16_t>(0x8000)));
  expect_eq(0xFFFFFFFF, (sign_extend<uint32_t, uint16_t>(0xFFFF)));
  expect_eq(0x0000000000000000, (sign_extend<uint64_t, uint16_t>(0x0000)));
  expect_eq(0x0000000000000001, (sign_extend<uint64_t, uint16_t>(0x0001)));
  expect_eq(0x0000000000007FFF, (sign_extend<uint64_t, uint16_t>(0x7FFF)));
  expect_eq(0xFFFFFFFFFFFF8000, (sign_extend<uint64_t, uint16_t>(0x8000)));
  expect_eq(0xFFFFFFFFFFFFFFFF, (sign_extend<uint64_t, uint16_t>(0xFFFF)));
  expect_eq(0x0000000000000000, (sign_extend<uint64_t, uint32_t>(0x00000000)));
  expect_eq(0x0000000000000001, (sign_extend<uint64_t, uint32_t>(0x00000001)));
  expect_eq(0x000000007FFFFFFF, (sign_extend<uint64_t, uint32_t>(0x7FFFFFFF)));
  expect_eq(0xFFFFFFFF80000000, (sign_extend<uint64_t, uint32_t>(0x80000000)));
  expect_eq(0xFFFFFFFFFFFFFFFF, (sign_extend<uint64_t, uint32_t>(0xFFFFFFFF)));

  expect_eq(0, (sign_extend<int16_t, uint8_t>(0x00)));
  expect_eq(1, (sign_extend<int16_t, uint8_t>(0x01)));
  expect_eq(127, (sign_extend<int16_t, uint8_t>(0x7F)));
  expect_eq(-128, (sign_extend<int16_t, uint8_t>(0x80)));
  expect_eq(-1, (sign_extend<int16_t, uint8_t>(0xFF)));
  expect_eq(0, (sign_extend<int32_t, uint8_t>(0x00)));
  expect_eq(1, (sign_extend<int32_t, uint8_t>(0x01)));
  expect_eq(127, (sign_extend<int32_t, uint8_t>(0x7F)));
  expect_eq(-128, (sign_extend<int32_t, uint8_t>(0x80)));
  expect_eq(-1, (sign_extend<int32_t, uint8_t>(0xFF)));
  expect_eq(0, (sign_extend<int64_t, uint8_t>(0x00)));
  expect_eq(1, (sign_extend<int64_t, uint8_t>(0x01)));
  expect_eq(127, (sign_extend<int64_t, uint8_t>(0x7F)));
  expect_eq(-128, (sign_extend<int64_t, uint8_t>(0x80)));
  expect_eq(-1, (sign_extend<int64_t, uint8_t>(0xFF)));
  expect_eq(0, (sign_extend<int32_t, uint16_t>(0x0000)));
  expect_eq(1, (sign_extend<int32_t, uint16_t>(0x0001)));
  expect_eq(32767, (sign_extend<int32_t, uint16_t>(0x7FFF)));
  expect_eq(-32768, (sign_extend<int32_t, uint16_t>(0x8000)));
  expect_eq(-1, (sign_extend<int32_t, uint16_t>(0xFFFF)));
  expect_eq(0, (sign_extend<int64_t, uint16_t>(0x0000)));
  expect_eq(1, (sign_extend<int64_t, uint16_t>(0x0001)));
  expect_eq(32767, (sign_extend<int64_t, uint16_t>(0x7FFF)));
  expect_eq(-32768, (sign_extend<int64_t, uint16_t>(0x8000)));
  expect_eq(-1, (sign_extend<int64_t, uint16_t>(0xFFFF)));
  expect_eq(0, (sign_extend<int64_t, uint32_t>(0x00000000)));
  expect_eq(1, (sign_extend<int64_t, uint32_t>(0x00000001)));
  expect_eq(2147483647, (sign_extend<int64_t, uint32_t>(0x7FFFFFFF)));
  expect_eq(-2147483648, (sign_extend<int64_t, uint32_t>(0x80000000)));
  expect_eq(-1, (sign_extend<int64_t, uint32_t>(0xFFFFFFFF)));

  expect_eq(0x2301, bswap16(0x0123));
  expect_eq(0x452301, bswap24(0x012345));
  expect_eq(0x674523, bswap24(0x01234567));
  expect_eq(0x67452301, bswap32(0x01234567));
  expect_eq(0xEFCDAB8967452301, bswap64(0x0123456789ABCDEF));

  expect_eq((uint16_t)-1, bswap16(-1));
  expect_eq((uint32_t)0x00FFFFFF, bswap24(-1));
  expect_eq((int32_t)-1, bswap24s(-1));
  expect_eq((uint32_t)-1, bswap32(-1));
  expect_eq((uint64_t)-1, bswap64(-1));

  expect_eq((uint16_t)-257, bswap16(-2));
  expect_eq((int32_t)-65537, bswap24s(-2));
  expect_eq((uint32_t)-16777217, bswap32(-2));
  expect_eq((uint64_t)-72057594037927937, bswap64(-2));

  expect_eq(2.6f, bswap32f((uint32_t)0x66662640));
  expect_eq(0x66662640UL, bswap32f(2.6f));
  expect_eq(3.1, bswap64f((uint64_t)0xCDCCCCCCCCCC0840));
  expect_eq(0xCDCCCCCCCCCC0840, bswap64f(3.1));

  {
    re_uint32_t x;
    x = 3;
    expect_eq(3, x);
    expect_eq(0x03000000, x.load_raw());
    uint32_t y = x;
    expect_eq(3, y);
  }
  {
    re_uint64_t x(0x0102030405060708);
    expect_eq(0x0102030405060708, x);
    expect_eq(0x0807060504030201, x.load_raw());
  }
  {
    re_double x(1.0);
    expect_eq(1.0, x);
    expect_eq(0x000000000000F03F, x.load_raw());
  }

  {
    union {
      uint8_t bytes[4];
      le_uint32_t le32;
      be_uint32_t be32;
    } data;

    data.le32 = 0x01020304;
    expect_eq(data.be32, 0x04030201);
    expect_eq(data.bytes[0], 0x04);
    data.be32 = 0x01020304;
    expect_eq(data.le32, 0x04030201);
    expect_eq(data.bytes[0], 0x01);
  }

  // TODO: test custom alphabets
  expect_eq("", base64_encode("", 0));
  expect_eq("MQ==", base64_encode("1", 1));
  expect_eq("MTE=", base64_encode("11", 2));
  expect_eq("MTEx", base64_encode("111", 3));
  expect_eq("MTExMg==", base64_encode("1112", 4));
  expect_eq("MTExMjI=", base64_encode("11122", 5));
  expect_eq("MTExMjIy", base64_encode("111222", 6));

  expect_eq("", base64_decode("", 0));
  expect_eq("1", base64_decode("MQ==", 4));
  expect_eq("11", base64_decode("MTE=", 4));
  expect_eq("111", base64_decode("MTEx", 4));
  expect_eq("1112", base64_decode("MTExMg==", 8));
  expect_eq("11122", base64_decode("MTExMjI=", 8));
  expect_eq("111222", base64_decode("MTExMjIy", 8));

  expect_eq("The brick quown jox fumps over the dazy log", rot13("Gur oevpx dhbja wbk shzcf bire gur qnml ybt", 43));

  printf("EncodingTest: all tests passed\n");
  return 0;
}